

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O0

void __thiscall APowerInvulnerable::EndEffect(APowerInvulnerable *this)

{
  bool bVar1;
  uint uVar2;
  AActor *pAVar3;
  Self local_20;
  TFlags<ActorFlag,_unsigned_int> local_1c;
  Self local_18;
  Self local_14;
  APowerInvulnerable *local_10;
  APowerInvulnerable *this_local;
  
  local_10 = this;
  APowerup::EndEffect(&this->super_APowerup);
  bVar1 = TObjPtr<AActor>::operator==(&(this->super_APowerup).super_AInventory.Owner,(AActor *)0x0);
  if (!bVar1) {
    operator~((EnumType)&local_14);
    pAVar3 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
    TFlags<ActorFlag2,_unsigned_int>::operator&=(&pAVar3->flags2,&local_14);
    pAVar3 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
    pAVar3->effects = pAVar3->effects & 0xffffffdf;
    bVar1 = FName::operator==(&(this->super_APowerup).Mode.super_FName,NAME_Ghost);
    if (bVar1) {
      operator~((EnumType)&local_18);
      pAVar3 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
      TFlags<ActorFlag2,_unsigned_int>::operator&=(&pAVar3->flags2,&local_18);
      pAVar3 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
      TFlags<ActorFlag,_unsigned_int>::operator&
                (&local_1c,(int)pAVar3 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE))
      ;
      uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_1c);
      if (uVar2 == 0) {
        pAVar3 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
        FRenderStyle::operator=((FRenderStyle *)&(pAVar3->RenderStyle).field_0,STYLE_Normal);
        pAVar3 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
        pAVar3->Alpha = 1.0;
      }
    }
    else {
      bVar1 = FName::operator==(&(this->super_APowerup).Mode.super_FName,NAME_Reflective);
      if (bVar1) {
        operator~((EnumType)&local_20);
        pAVar3 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
        TFlags<ActorFlag2,_unsigned_int>::operator&=(&pAVar3->flags2,&local_20);
      }
    }
    pAVar3 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
    if (pAVar3->player != (player_t *)0x0) {
      pAVar3 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
      pAVar3->player->fixedcolormap = -1;
    }
  }
  return;
}

Assistant:

void APowerInvulnerable::EndEffect ()
{
	Super::EndEffect();

	if (Owner == NULL)
	{
		return;
	}

	Owner->flags2 &= ~MF2_INVULNERABLE;
	Owner->effects &= ~FX_RESPAWNINVUL;
	if (Mode == NAME_Ghost)
	{
		Owner->flags2 &= ~MF2_NONSHOOTABLE;
		if (!(Owner->flags & MF_SHADOW))
		{
			// Don't mess with the translucency settings if an
			// invisibility powerup is active.
			Owner->RenderStyle = STYLE_Normal;
			Owner->Alpha = 1.;
		}
	}
	else if (Mode == NAME_Reflective)
	{
		Owner->flags2 &= ~MF2_REFLECTIVE;
	}

	if (Owner->player != NULL)
	{
		Owner->player->fixedcolormap = NOFIXEDCOLORMAP;
	}
}